

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

void background_thread_init(tsd_t *tsd,background_thread_info_t *info)

{
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[7] = '\x01';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[8] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[9] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[10] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0xb] = '\0';
  duckdb_je_nstime_init
            ((nstime_t *)
             ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard + 0xf)
             ,0);
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x17] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x18] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x19] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1a] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1b] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1c] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1d] = '\0';
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1e] = '\0';
  *(undefined8 *)
   ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard + 0x1f) = 0;
  duckdb_je_nstime_copy
            ((nstime_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link,
             &nstime_zero);
  duckdb_je_n_background_threads = duckdb_je_n_background_threads + 1;
  return;
}

Assistant:

static void
background_thread_init(tsd_t *tsd, background_thread_info_t *info) {
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);
	info->state = background_thread_started;
	background_thread_info_init(tsd_tsdn(tsd), info);
	n_background_threads++;
}